

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_log.cpp
# Opt level: O2

void __thiscall cubeb_async_logger::stop(cubeb_async_logger *this)

{
  __int_type_conflict _Var1;
  ring_buffer_base<cubeb_log_message> *prVar2;
  bool bVar3;
  undefined8 in_RAX;
  ring_buffer_base<cubeb_log_message> *owned_queue;
  
  LOCK();
  _Var1 = (this->shutdown_thread)._M_base._M_i;
  (this->shutdown_thread)._M_base._M_i = true;
  owned_queue = (ring_buffer_base<cubeb_log_message> *)CONCAT71((int7)((ulong)in_RAX >> 8),_Var1);
  UNLOCK();
  if ((this->logging_thread)._M_id._M_thread != 0) {
    std::thread::join();
    owned_queue = (ring_buffer_base<cubeb_log_message> *)0x0;
    std::thread::operator=(&this->logging_thread,(thread *)&owned_queue);
    std::thread::~thread((thread *)&owned_queue);
    owned_queue = (this->msg_queue)._M_b._M_p;
    do {
      bVar3 = std::atomic<ring_buffer_base<cubeb_log_message>_*>::compare_exchange_weak
                        (&this->msg_queue,&owned_queue,(__pointer_type)0x0,memory_order_seq_cst);
      prVar2 = owned_queue;
    } while (!bVar3);
    if (owned_queue != (ring_buffer_base<cubeb_log_message> *)0x0) {
      std::unique_ptr<cubeb_log_message[],_std::default_delete<cubeb_log_message[]>_>::~unique_ptr
                (&owned_queue->data_);
    }
    operator_delete(prVar2,0x18);
    LOCK();
    (this->msg_queue_consumer)._M_b._M_p = (__pointer_type)0x0;
    UNLOCK();
  }
  return;
}

Assistant:

void stop()
  {
    assert(((g_cubeb_log_callback == cubeb_noop_log_callback) ||
            !g_cubeb_log_callback) &&
           "Only call stop after logging has been disabled.");
    shutdown_thread = true;
    if (logging_thread.get_id() != std::thread::id()) {
      logging_thread.join();
      logging_thread = std::thread();
      auto * owned_queue = msg_queue.load();
      // Check if the queue is being used. If not, grab ownership. If yes,
      // try again shortly. At this point, the logging thread has been joined,
      // so nothing is going to dequeue.
      // If there is a valid pointer here, then the real-time audio thread that
      // logs won't attempt to write into the queue, and instead drop the
      // message.
      while (!msg_queue.compare_exchange_weak(owned_queue, nullptr)) {
      }
      delete owned_queue;
      msg_queue_consumer.store(nullptr);
    }
  }